

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O2

bool __thiscall
HighsMipSolverData::checkSolution
          (HighsMipSolverData *this,vector<double,_std::allocator<double>_> *solution)

{
  double *pdVar1;
  double dVar2;
  uint uVar3;
  HighsLp *pHVar4;
  pointer pdVar5;
  pointer piVar6;
  HighsInt j;
  long lVar7;
  HighsInt i;
  ulong uVar8;
  bool bVar9;
  double dVar10;
  double dVar11;
  
  pHVar4 = this->mipsolver->model_;
  uVar3 = pHVar4->num_col_;
  pdVar5 = (solution->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  dVar2 = this->feastol;
  uVar8 = 0;
  while( true ) {
    if (uVar3 == uVar8) {
      piVar6 = (this->ARstart_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar8 = 0;
      while( true ) {
        bVar9 = uVar8 == (uint)pHVar4->num_row_;
        if (bVar9) {
          return true;
        }
        dVar11 = 0.0;
        for (lVar7 = (long)piVar6[uVar8]; piVar6[uVar8 + 1] != lVar7; lVar7 = lVar7 + 1) {
          dVar11 = dVar11 + pdVar5[(this->ARindex_).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[lVar7]] *
                            (this->ARvalue_).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[lVar7];
        }
        if ((pHVar4->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar8] + dVar2 < dVar11) break;
        pdVar1 = (pHVar4->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar8;
        uVar8 = uVar8 + 1;
        if (dVar11 < *pdVar1 - dVar2) {
          return bVar9;
        }
      }
      return bVar9;
    }
    dVar11 = pdVar5[uVar8];
    if (((dVar11 < (pHVar4->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar8] - dVar2) ||
        ((pHVar4->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[uVar8] + dVar2 < dVar11)) ||
       (((pHVar4->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
         _M_impl.super__Vector_impl_data._M_start[uVar8] == kInteger &&
        (dVar10 = round(dVar11), dVar2 < ABS(dVar11 - dVar10))))) break;
    uVar8 = uVar8 + 1;
  }
  return false;
}

Assistant:

bool HighsMipSolverData::checkSolution(
    const std::vector<double>& solution) const {
  for (HighsInt i = 0; i != mipsolver.model_->num_col_; ++i) {
    if (solution[i] < mipsolver.model_->col_lower_[i] - feastol) return false;
    if (solution[i] > mipsolver.model_->col_upper_[i] + feastol) return false;
    if (mipsolver.variableType(i) == HighsVarType::kInteger &&
        fractionality(solution[i]) > feastol)
      return false;
  }

  for (HighsInt i = 0; i != mipsolver.model_->num_row_; ++i) {
    double rowactivity = 0.0;

    HighsInt start = ARstart_[i];
    HighsInt end = ARstart_[i + 1];

    for (HighsInt j = start; j != end; ++j)
      rowactivity += solution[ARindex_[j]] * ARvalue_[j];

    if (rowactivity > mipsolver.rowUpper(i) + feastol) return false;
    if (rowactivity < mipsolver.rowLower(i) - feastol) return false;
  }

  return true;
}